

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsetpos.c
# Opt level: O0

int fsetpos(FILE *__stream,fpos_t *__pos)

{
  int iVar1;
  long lVar2;
  _PDCLIB_fpos_t *pos_local;
  _PDCLIB_file_t *stream_local;
  
  mtx_lock((mtx_t *)&__stream->_IO_save_base);
  if ((((ulong)__stream->_IO_buf_end & 0x1000000000) == 0) ||
     (iVar1 = _PDCLIB_flushbuffer((_PDCLIB_file_t *)__stream), iVar1 != -1)) {
    lVar2 = _PDCLIB_seek((_PDCLIB_file_t *)__stream,__pos->__pos,0);
    if (lVar2 == -1) {
      mtx_unlock((mtx_t *)&__stream->_IO_save_base);
      stream_local._4_4_ = -1;
    }
    else {
      *(int *)&__stream->_IO_write_end = (__pos->__state).__count;
      mtx_unlock((mtx_t *)&__stream->_IO_save_base);
      stream_local._4_4_ = 0;
    }
  }
  else {
    mtx_unlock((mtx_t *)&__stream->_IO_save_base);
    stream_local._4_4_ = -1;
  }
  return stream_local._4_4_;
}

Assistant:

int fsetpos( struct _PDCLIB_file_t * stream, const struct _PDCLIB_fpos_t * pos )
{
    _PDCLIB_LOCK( stream->mtx );

    if ( stream->status & _PDCLIB_FWRITE )
    {
        if ( _PDCLIB_flushbuffer( stream ) == EOF )
        {
            _PDCLIB_UNLOCK( stream->mtx );
            return EOF;
        }
    }

    if ( _PDCLIB_seek( stream, pos->offset, SEEK_SET ) == EOF )
    {
        _PDCLIB_UNLOCK( stream->mtx );
        return EOF;
    }

    stream->pos.status = pos->status;
    /* TODO: Add mbstate. */

    _PDCLIB_UNLOCK( stream->mtx );

    return 0;
}